

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O3

DdNode * Extra_bddSpaceReduce(DdManager *dd,DdNode *bFunc,DdNode *bCanonVars)

{
  DdNode *n;
  DdNode *n_00;
  
  n = Extra_bddSupportNegativeCube(dd,bCanonVars);
  Cudd_Ref(n);
  n_00 = Cudd_Cofactor(dd,bFunc,n);
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(dd,n);
  Cudd_Deref(n_00);
  return n_00;
}

Assistant:

DdNode * Extra_bddSpaceReduce( DdManager * dd, DdNode * bFunc, DdNode * bCanonVars )
{
	DdNode * bNegCube;
	DdNode * bResult;
	bNegCube = Extra_bddSupportNegativeCube( dd, bCanonVars );  Cudd_Ref( bNegCube );
	bResult  = Cudd_Cofactor( dd, bFunc, bNegCube );            Cudd_Ref( bResult );
	Cudd_RecursiveDeref( dd, bNegCube );
	Cudd_Deref( bResult );
	return bResult;
}